

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O3

void av1_highbd_upsample_intra_edge_c(uint16_t *p,int sz,int bd)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint16_t uVar6;
  bool bVar7;
  uint16_t in [19];
  ushort local_54 [22];
  
  uVar1 = p[-1];
  if (0 < sz) {
    memcpy(local_54,p,(ulong)(uint)(sz * 2));
  }
  local_54[sz] = p[(long)sz + -1];
  p[-2] = uVar1;
  if (0 < sz) {
    uVar5 = 0;
    uVar4 = (uint)uVar1;
    uVar2 = (uint)uVar1;
    do {
      uVar3 = uVar4;
      uVar1 = local_54[uVar5 + 1];
      uVar4 = (int)(((local_54[0] + uVar3) * 9 - (uVar2 + uVar1)) + 8) >> 4;
      if (bd == 10) {
        bVar7 = uVar4 < 0x3ff;
        uVar2 = 0x3ff;
      }
      else if (bd == 0xc) {
        bVar7 = uVar4 < 0xfff;
        uVar2 = 0xfff;
      }
      else {
        bVar7 = uVar4 < 0xff;
        uVar2 = 0xff;
      }
      if (bVar7) {
        uVar2 = uVar4;
      }
      uVar6 = (uint16_t)uVar2;
      if ((int)uVar4 < 0) {
        uVar6 = 0;
      }
      p[uVar5 * 2 + -1] = uVar6;
      p[uVar5 * 2] = local_54[0];
      uVar5 = uVar5 + 1;
      uVar4 = (uint)local_54[0];
      uVar2 = uVar3;
      local_54[0] = uVar1;
    } while ((uint)sz != uVar5);
  }
  return;
}

Assistant:

void av1_highbd_upsample_intra_edge_c(uint16_t *p, int sz, int bd) {
  // interpolate half-sample positions
  assert(sz <= MAX_UPSAMPLE_SZ);

  uint16_t in[MAX_UPSAMPLE_SZ + 3];
  // copy p[-1..(sz-1)] and extend first and last samples
  in[0] = p[-1];
  in[1] = p[-1];
  for (int i = 0; i < sz; i++) {
    in[i + 2] = p[i];
  }
  in[sz + 2] = p[sz - 1];

  // interpolate half-sample edge positions
  p[-2] = in[0];
  for (int i = 0; i < sz; i++) {
    int s = -in[i] + (9 * in[i + 1]) + (9 * in[i + 2]) - in[i + 3];
    s = (s + 8) >> 4;
    s = clip_pixel_highbd(s, bd);
    p[2 * i - 1] = s;
    p[2 * i] = in[i + 2];
  }
}